

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlat<unsigned_short,unsigned_short,unsigned_short,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseXOROperator,bool,false,false>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  byte fun_00;
  bool bVar1;
  TemplatedValidityMask<unsigned_long> *this;
  TemplatedValidityMask<unsigned_long> *count_00;
  ValidityMask *pVVar2;
  ValidityMask *in_RCX;
  Vector *in_RDX;
  unsigned_short *in_RSI;
  unsigned_short *in_RDI;
  byte in_R8B;
  unsigned_short *unaff_retaddr;
  ValidityMask *result_validity;
  unsigned_short *result_data;
  unsigned_short *rdata;
  unsigned_short *ldata;
  ValidityMask *in_stack_ffffffffffffff88;
  TemplatedValidityMask<unsigned_long> *other;
  Vector *pVVar3;
  
  fun_00 = in_R8B & 1;
  FlatVector::GetData<unsigned_short>((Vector *)0xe5e34b);
  FlatVector::GetData<unsigned_short>((Vector *)0xe5e35a);
  duckdb::Vector::SetVectorType((VectorType)in_RDX);
  this = (TemplatedValidityMask<unsigned_long> *)
         FlatVector::GetData<unsigned_short>((Vector *)0xe5e375);
  count_00 = &FlatVector::Validity((Vector *)0xe5e384)->super_TemplatedValidityMask<unsigned_long>;
  bVar1 = BinaryStandardOperatorWrapper::AddsNulls();
  if (bVar1) {
    other = count_00;
    FlatVector::Validity((Vector *)0xe5e3ab);
    TemplatedValidityMask<unsigned_long>::Copy(this,other,(idx_t)count_00);
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(other);
    if (bVar1) {
      FlatVector::Validity((Vector *)0xe5e3e1);
      TemplatedValidityMask<unsigned_long>::Copy(this,other,(idx_t)count_00);
    }
    else {
      pVVar2 = FlatVector::Validity((Vector *)0xe5e409);
      duckdb::ValidityMask::Combine((ValidityMask *)other,(ulong)pVVar2);
    }
  }
  else {
    pVVar3 = in_RDX;
    FlatVector::Validity((Vector *)0xe5e431);
    FlatVector::SetValidity(in_RDX,in_stack_ffffffffffffff88);
    pVVar2 = FlatVector::Validity((Vector *)0xe5e452);
    duckdb::ValidityMask::Combine((ValidityMask *)count_00,(ulong)pVVar2);
    in_RDX = pVVar3;
  }
  ExecuteFlatLoop<unsigned_short,unsigned_short,unsigned_short,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseXOROperator,bool,false,false>
            (unaff_retaddr,in_RDI,in_RSI,(idx_t)in_RDX,in_RCX,(bool)fun_00);
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}